

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5219:13)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5219:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *pEVar1;
  WebSocketResponse *in;
  Own<kj::WebSocket,_std::nullptr_t> local_580;
  ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> local_570;
  WebSocketResponse *local_3c8;
  WebSocketResponse *depValue;
  WebSocketResponse *_depValue779;
  Exception *local_210;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1f0 [8];
  ExceptionOr<kj::HttpClient::WebSocketResponse> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5219:13)>
  *this_local;
  
  depResult.value.ptr.field_1._48_8_ = output;
  ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
            ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1f0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1f0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1f0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::HttpClient::WebSocketResponse>
                         ((Maybe<kj::HttpClient::WebSocketResponse> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (WebSocketResponse *)0x0) {
      local_3c8 = depValue;
      in = mv<kj::HttpClient::WebSocketResponse>(depValue);
      MaybeVoidCaller<kj::HttpClient::WebSocketResponse,kj::Own<kj::WebSocket,decltype(nullptr)>>::
      apply<kj::(anonymous_namespace)::TestCase5164::run()::__4>
                ((MaybeVoidCaller<kj::HttpClient::WebSocketResponse,kj::Own<kj::WebSocket,decltype(nullptr)>>
                  *)&local_580,(Type *)&this->field_0x20,in);
      TransformPromiseNodeBase::handle<kj::Own<kj::WebSocket,decltype(nullptr)>>
                (&local_570,&this->super_TransformPromiseNodeBase,&local_580);
      pEVar1 = ExceptionOrValue::as<kj::Own<kj::WebSocket,decltype(nullptr)>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._48_8_);
      ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=(pEVar1,&local_570);
      ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::~ExceptionOr(&local_570);
      Own<kj::WebSocket,_std::nullptr_t>::~Own(&local_580);
    }
  }
  else {
    local_210 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::ExceptionOr
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)&_depValue779,false,exception
              );
    pEVar1 = ExceptionOrValue::as<kj::Own<kj::WebSocket,decltype(nullptr)>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._48_8_);
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=
              (pEVar1,(ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)&_depValue779);
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::~ExceptionOr
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)&_depValue779);
  }
  ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr
            ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1f0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }